

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

void __thiscall Sudoku::print(Sudoku *this)

{
  int y;
  long lVar1;
  int x;
  long lVar2;
  
  for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
      if ((*(byte *)((long)this + lVar2 * 4) & 0xf) == 0) {
        std::operator<<((ostream *)&std::cout,".");
      }
      else {
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    this = (Sudoku *)((long)this + 0x24);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Sudoku::print( void )
{
  for(int y=0;y<9;y++)
  {
    for(int x=0;x<9;x++)
    {
      if (s.pole[y*9+x].zapsane)
        cout<< s.pole[y*9+x].zapsane;
      else
        cout<< ".";
    } 
    cout << endl;
  }
   cout << endl;
}